

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool haltOnSubcommand)

{
  pointer *pppOVar1;
  pointer puVar2;
  Option *pOVar3;
  _Head_base<0UL,_CLI::Option_*,_false> _Var4;
  pointer pcVar5;
  iterator __position;
  pointer psVar6;
  pointer pbVar7;
  element_type *peVar8;
  size_type sVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  type_conflict tVar11;
  bool bVar12;
  iterator __begin1;
  App *pAVar13;
  ExtrasError *this_00;
  int iVar14;
  ulong uVar15;
  undefined7 in_register_00000011;
  pointer puVar16;
  pointer pbVar17;
  pointer psVar18;
  pointer puVar19;
  uint uVar20;
  App *pAVar21;
  long lVar22;
  Option *posOpt;
  string pos;
  _Head_base<0UL,_CLI::Option_*,_false> local_e8;
  pointer local_e0;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  undefined4 local_ac;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  local_ac = (undefined4)CONCAT71(in_register_00000011,haltOnSubcommand);
  local_e0 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_e8._M_head_impl = (Option *)0x0;
  local_b8 = args;
  if (this->positionals_at_end_ == true) {
    puVar19 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar19 != puVar2) {
      uVar15 = 0;
      puVar16 = puVar19;
      do {
        pOVar3 = (puVar16->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        if (((((pOVar3->pname_)._M_string_length != 0) &&
             ((pOVar3->super_OptionBase<CLI::Option>).required_ == true)) &&
            (uVar20 = pOVar3->expected_min_ * pOVar3->type_size_min_, 0 < (int)uVar20)) &&
           (lVar22 = (long)(pOVar3->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     *(long *)&(pOVar3->results_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl >> 5, (int)lVar22 < (int)uVar20)) {
          uVar15 = (uVar15 + uVar20) - lVar22;
        }
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar2);
      if ((ulong)((long)local_e0 -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar15 &&
          puVar19 != puVar2) {
        do {
          _Var4._M_head_impl =
               (puVar19->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          if (((((_Var4._M_head_impl)->pname_)._M_string_length != 0) &&
              (((_Var4._M_head_impl)->super_OptionBase<CLI::Option>).required_ == true)) &&
             ((int)((ulong)((long)((_Var4._M_head_impl)->results_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           *(long *)&((_Var4._M_head_impl)->results_).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data) >> 5) <
              (_Var4._M_head_impl)->expected_min_ * (_Var4._M_head_impl)->type_size_min_)) {
            if (this->validate_positionals_ == false) goto LAB_00134651;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            pcVar5 = local_e0[-1]._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,pcVar5,pcVar5 + local_e0[-1]._M_string_length);
            Option::_validate(&local_a8,
                              (puVar19->_M_t).
                              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                              .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_d8,0)
            ;
            ::std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            sVar9 = local_d8._M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
            if (sVar9 == 0) {
              _Var4._M_head_impl =
                   (puVar19->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
              if (_Var4._M_head_impl != (Option *)0x0) goto LAB_00134651;
              local_e8._M_head_impl = (Option *)0x0;
              break;
            }
          }
          puVar19 = puVar19 + 1;
        } while (puVar19 != puVar2);
      }
    }
  }
  puVar19 = (this->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar19 != puVar2) {
    do {
      pOVar3 = (puVar19->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if ((pOVar3->pname_)._M_string_length != 0) {
        pbVar17 = (pOVar3->results_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar22 = *(long *)&(pOVar3->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl;
        local_d8._M_dataplus._M_p._0_4_ = pOVar3->type_size_max_;
        tVar11 = detail::checked_multiply<int>((int *)&local_d8,pOVar3->expected_max_);
        iVar14 = 0x20000000;
        if (tVar11) {
          iVar14 = (int)local_d8._M_dataplus._M_p;
        }
        if (((int)((ulong)((long)pbVar17 - lVar22) >> 5) < iVar14) ||
           (((puVar19->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true))
        {
          if (this->validate_positionals_ == true) {
            pcVar5 = local_e0[-1]._M_dataplus._M_p;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,pcVar5,pcVar5 + local_e0[-1]._M_string_length);
            Option::_validate(&local_a8,
                              (puVar19->_M_t).
                              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                              .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_d8,0)
            ;
            ::std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            sVar9 = local_d8._M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
            if (sVar9 != 0) goto LAB_00134634;
          }
          local_e8._M_head_impl =
               (puVar19->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          _Var4._M_head_impl = local_e8._M_head_impl;
          if (local_e8._M_head_impl != (Option *)0x0) {
LAB_00134651:
            local_e8._M_head_impl = _Var4._M_head_impl;
            __position._M_current =
                 (this->parse_order_).
                 super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->parse_order_).
                super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::
              _M_realloc_insert<CLI::Option*const&>
                        ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                         __position,&local_e8._M_head_impl);
            }
            else {
              *__position._M_current = local_e8._M_head_impl;
              pppOVar1 = &(this->parse_order_).
                          super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppOVar1 = *pppOVar1 + 1;
            }
            pvVar10 = local_b8;
            _Var4._M_head_impl = local_e8._M_head_impl;
            if ((((local_e8._M_head_impl)->inject_separator_ == true) &&
                (pbVar17 = ((local_e8._M_head_impl)->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                ((local_e8._M_head_impl)->results_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != pbVar17)) &&
               (pbVar17[-1]._M_string_length != 0)) {
              local_50._M_string_length = 0;
              local_50.field_2._M_local_buf[0] = '\0';
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              Option::_add_result(local_e8._M_head_impl,&local_50,&(local_e8._M_head_impl)->results_
                                 );
              (_Var4._M_head_impl)->current_option_state_ = parsing;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
            }
            _Var4._M_head_impl = local_e8._M_head_impl;
            if (((local_e8._M_head_impl)->trigger_on_result_ == true) &&
               ((local_e8._M_head_impl)->current_option_state_ == callback_run)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&(local_e8._M_head_impl)->results_);
              (_Var4._M_head_impl)->current_option_state_ = parsing;
            }
            _Var4._M_head_impl = local_e8._M_head_impl;
            pcVar5 = local_e0[-1]._M_dataplus._M_p;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar5,pcVar5 + local_e0[-1]._M_string_length);
            Option::_add_result(_Var4._M_head_impl,&local_70,&(_Var4._M_head_impl)->results_);
            (_Var4._M_head_impl)->current_option_state_ = parsing;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((local_e8._M_head_impl)->trigger_on_result_ == true) {
              Option::run_callback(local_e8._M_head_impl);
            }
            pbVar17 = (pvVar10->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            (pvVar10->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = pbVar17 + -1;
            pcVar5 = pbVar17[-1]._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar5 != &pbVar17[-1].field_2) {
              operator_delete(pcVar5);
              return true;
            }
            return true;
          }
          break;
        }
      }
LAB_00134634:
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar2);
  }
  pvVar10 = local_b8;
  psVar6 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar18 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar18 != psVar6; psVar18 = psVar18 + 1
      ) {
    pAVar13 = (psVar18->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((pAVar13->name_)._M_string_length == 0) && (pAVar13->disabled_ == false)) &&
       (bVar12 = _parse_positional(pAVar13,pvVar10,false), bVar12)) {
      peVar8 = (psVar18->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar8->pre_parse_called_ != false) {
        return true;
      }
      pbVar17 = (pvVar10->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar7 = (pvVar10->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      peVar8->pre_parse_called_ = true;
      if ((peVar8->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_d8._M_dataplus._M_p = (pointer)((long)pbVar7 - (long)pbVar17 >> 5);
        (*(peVar8->pre_parse_callback_)._M_invoker)
                  ((_Any_data *)&peVar8->pre_parse_callback_,(unsigned_long *)&local_d8);
        return true;
      }
      return true;
    }
  }
  if ((this->parent_ != (App *)0x0) && (pAVar13 = this->parent_, this->fallthrough_ == true)) {
    do {
      pAVar21 = pAVar13;
      if (pAVar21->parent_ == (App *)0x0) break;
      pAVar13 = pAVar21->parent_;
    } while ((pAVar21->name_)._M_string_length == 0);
    bVar12 = _parse_positional(pAVar21,pvVar10,
                               (this->parse_complete_callback_).super__Function_base._M_manager !=
                               (_Manager_type)0x0);
    return bVar12;
  }
  pAVar13 = _find_subcommand(this,(pvVar10->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
  if ((pAVar13 == (App *)0x0) ||
     ((this->require_subcommand_max_ != 0 &&
      (this->require_subcommand_max_ <=
       (ulong)((long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3))))) {
    if (this->subcommand_fallthrough_ == true) {
      pAVar13 = this->parent_;
      pAVar21 = this;
      if (this->parent_ != (App *)0x0) {
        do {
          pAVar21 = pAVar13;
          if (pAVar21->parent_ == (App *)0x0) break;
          pAVar13 = pAVar21->parent_;
        } while ((pAVar21->name_)._M_string_length == 0);
      }
      pAVar13 = _find_subcommand(pAVar21,(pvVar10->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish + -1,true,false
                                );
      if (pAVar13 != (App *)0x0) {
        pAVar13 = pAVar13->parent_;
        if (pAVar13->require_subcommand_max_ == 0) {
          return false;
        }
        if ((ulong)((long)(pAVar13->parsed_subcommands_).
                          super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pAVar13->parsed_subcommands_).
                          super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < pAVar13->require_subcommand_max_)
        {
          return false;
        }
      }
    }
    if (this->positionals_at_end_ == true) {
      this_00 = (ExtrasError *)__cxa_allocate_exception(0x38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_88,pvVar10);
      ExtrasError::ExtrasError(this_00,&this->name_,&local_88);
      __cxa_throw(this_00,&ExtrasError::typeinfo,Error::~Error);
    }
    if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
      local_e0 = local_e0 + -1;
      local_d8._M_dataplus._M_p = local_d8._M_dataplus._M_p & 0xffffffff00000000;
      pAVar13 = this;
      if (this->allow_extras_ == false) {
        psVar18 = (this->subcommands_).
                  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while ((pAVar13 = this,
               psVar18 !=
               (this->subcommands_).
               super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
               ._M_impl.super__Vector_impl_data._M_finish &&
               ((pAVar13 = (psVar18->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr, (pAVar13->name_)._M_string_length != 0 ||
                (pAVar13->allow_extras_ == false))))) {
          psVar18 = psVar18 + 1;
        }
      }
      ::std::
      vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                  *)&pAVar13->missing_,(Classifier *)&local_d8,local_e0);
      pbVar17 = (pvVar10->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (pvVar10->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar17 + -1;
      pcVar5 = pbVar17[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != &pbVar17[-1].field_2) {
        operator_delete(pcVar5);
      }
      if (this->prefix_command_ == true) {
        pbVar17 = (pvVar10->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if ((pvVar10->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != pbVar17) {
          do {
            local_d8._M_dataplus._M_p = local_d8._M_dataplus._M_p & 0xffffffff00000000;
            pAVar13 = this;
            if (this->allow_extras_ == false) {
              psVar18 = (this->subcommands_).
                        super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              while ((pAVar13 = this,
                     psVar18 !=
                     (this->subcommands_).
                     super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish &&
                     ((pAVar13 = (psVar18->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)
                                 ._M_ptr, (pAVar13->name_)._M_string_length != 0 ||
                      (pAVar13->allow_extras_ == false))))) {
                psVar18 = psVar18 + 1;
              }
            }
            ::std::
            vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
            ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                      ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                        *)&pAVar13->missing_,(Classifier *)&local_d8,pbVar17 + -1);
            pbVar7 = (pvVar10->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pbVar17 = pbVar7 + -1;
            (pvVar10->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = pbVar17;
            pcVar5 = pbVar7[-1]._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar5 != &pbVar7[-1].field_2) {
              operator_delete(pcVar5);
              pbVar17 = (pvVar10->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            }
          } while ((pvVar10->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start != pbVar17);
          return true;
        }
        return true;
      }
      return true;
    }
  }
  else if ((char)local_ac == '\0') {
    pbVar17 = (pvVar10->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (pvVar10->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar17 + -1;
    pcVar5 = pbVar17[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &pbVar17[-1].field_2) {
      operator_delete(pcVar5);
    }
    _parse(pAVar13,pvVar10);
    return true;
  }
  return false;
}

Assistant:

CLI11_INLINE bool App::_parse_positional(std::vector<std::string> &args, bool haltOnSubcommand) {

    const std::string &positional = args.back();
    Option *posOpt{nullptr};

    if(positionals_at_end_) {
        // deal with the case of required arguments at the end which should take precedence over other arguments
        auto arg_rem = args.size();
        auto remreq = _count_remaining_positionals(true);
        if(arg_rem <= remreq) {
            for(const Option_p &opt : options_) {
                if(opt->get_positional() && opt->required_) {
                    if(static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                        if(validate_positionals_) {
                            std::string pos = positional;
                            pos = opt->_validate(pos, 0);
                            if(!pos.empty()) {
                                continue;
                            }
                        }
                        posOpt = opt.get();
                        break;
                    }
                }
            }
        }
    }
    if(posOpt == nullptr) {
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected_max() || opt->get_allow_extra_args())) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos, 0);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                posOpt = opt.get();
                break;
            }
        }
    }
    if(posOpt != nullptr) {
        parse_order_.push_back(posOpt);
        if(posOpt->get_inject_separator()) {
            if(!posOpt->results().empty() && !posOpt->results().back().empty()) {
                posOpt->add_result(std::string{});
            }
        }
        if(posOpt->get_trigger_on_parse() && posOpt->current_option_state_ == Option::option_state::callback_run) {
            posOpt->clear();
        }
        posOpt->add_result(positional);
        if(posOpt->get_trigger_on_parse()) {
            posOpt->run_callback();
        }

        args.pop_back();
        return true;
    }

    for(auto &subc : subcommands_) {
        if((subc->name_.empty()) && (!subc->disabled_)) {
            if(subc->_parse_positional(args, false)) {
                if(!subc->pre_parse_called_) {
                    subc->_trigger_pre_parse(args.size());
                }
                return true;
            }
        }
    }
    // let the parent deal with it if possible
    if(parent_ != nullptr && fallthrough_) {
        return _get_fallthrough_parent()->_parse_positional(args, static_cast<bool>(parse_complete_callback_));
    }
    /// Try to find a local subcommand that is repeated
    auto *com = _find_subcommand(args.back(), true, false);
    if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
        if(haltOnSubcommand) {
            return false;
        }
        args.pop_back();
        com->_parse(args);
        return true;
    }
    if(subcommand_fallthrough_) {
        /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
        /// subcommand in a broader way, if one exists let the parent deal with it
        auto *parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        com = parent_app->_find_subcommand(args.back(), true, false);
        if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                              com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
            return false;
        }
    }
    if(positionals_at_end_) {
        throw CLI::ExtrasError(name_, args);
    }
    /// If this is an option group don't deal with it
    if(parent_ != nullptr && name_.empty()) {
        return false;
    }
    /// We are out of other options this goes to missing
    _move_to_missing(detail::Classifier::NONE, positional);
    args.pop_back();
    if(prefix_command_) {
        while(!args.empty()) {
            _move_to_missing(detail::Classifier::NONE, args.back());
            args.pop_back();
        }
    }

    return true;
}